

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseInputFiles
          (CommandLineInterface *this,DescriptorPool *descriptor_pool,DiskSourceTree *source_tree,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference this_00;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  FileDescriptor *pFVar6;
  size_type in_R9;
  string_view sVar7;
  undefined1 auVar8 [16];
  FixedMapping replacements;
  string_view local_160;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_150;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_130;
  undefined8 local_128;
  undefined1 local_120 [16];
  string local_110;
  string_view local_f0;
  iterator local_e0;
  string_view local_d0;
  iterator local_c0;
  int local_b0;
  byte local_a9;
  int i;
  bool indirect_imports;
  string_view local_98;
  FileDescriptor *local_88;
  FileDescriptor *parsed_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file_1;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  DiskSourceTree *source_tree_local;
  DescriptorPool *descriptor_pool_local;
  CommandLineInterface *this_local;
  
  bVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->proto_path_);
  if (!bVar1) {
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->input_files_);
    input_file = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->input_files_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&input_file), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end3);
      sVar7 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
      DescriptorPool::AddDirectInputFile(descriptor_pool,sVar7,false);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  __range2._7_1_ = true;
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->input_files_);
  input_file_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->input_files_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&input_file_1);
    if (!bVar1) {
LAB_0024f64d:
      DescriptorPool::ClearDirectInputFiles(descriptor_pool);
      return __range2._7_1_;
    }
    parsed_file = (FileDescriptor *)
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
    sVar7 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)parsed_file);
    local_98 = sVar7;
    local_88 = DescriptorPool::FindFileByName(descriptor_pool,sVar7);
    if (local_88 == (FileDescriptor *)0x0) {
      __range2._7_1_ = false;
      goto LAB_0024f64d;
    }
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::push_back(parsed_files,&local_88);
    if ((this->disallow_services_ & 1U) != 0) {
      iVar2 = FileDescriptor::service_count(local_88);
      if (0 < iVar2) {
        _i = FileDescriptor::name(local_88);
        pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,_i);
        poVar5 = std::operator<<(pbVar4,
                                 ": This file contains services, but --disallow_services was used.")
        ;
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        __range2._7_1_ = false;
        goto LAB_0024f64d;
      }
    }
    if ((this->direct_dependencies_explicitly_set_ & 1U) != 0) {
      local_a9 = 0;
      local_b0 = 0;
      while( true ) {
        iVar2 = local_b0;
        iVar3 = FileDescriptor::dependency_count(local_88);
        if (iVar3 <= iVar2) break;
        pFVar6 = FileDescriptor::dependency(local_88,local_b0);
        local_d0 = FileDescriptor::name(pFVar6);
        local_c0 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                               *)&this->direct_dependencies_,&local_d0);
        local_e0 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&(this->direct_dependencies_).
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        );
        bVar1 = absl::lts_20250127::container_internal::operator==(&local_c0,&local_e0);
        if (bVar1) {
          local_a9 = 1;
          local_f0 = FileDescriptor::name(local_88);
          pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                                   local_f0);
          poVar5 = std::operator<<(pbVar4,": ");
          auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)&this->direct_dependencies_violation_msg_);
          local_120 = auVar8;
          pFVar6 = FileDescriptor::dependency(local_88,local_b0);
          local_160 = FileDescriptor::name(pFVar6);
          std::
          pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::pair<const_char_(&)[3],_std::basic_string_view<char,_std::char_traits<char>_>,_true>
                    (&local_150,(char (*) [3])0x852f1f,&local_160);
          local_128 = 1;
          sVar7._M_str = (char *)&local_150;
          sVar7._M_len = local_120._8_8_;
          replacements._M_len = in_R9;
          replacements._M_array = (iterator)0x1;
          local_130 = &local_150;
          absl::lts_20250127::StrReplaceAll_abi_cxx11_
                    (&local_110,(lts_20250127 *)local_120._0_8_,sVar7,replacements);
          poVar5 = std::operator<<(poVar5,(string *)&local_110);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_110);
        }
        local_b0 = local_b0 + 1;
      }
      if ((local_a9 & 1) != 0) {
        __range2._7_1_ = false;
        goto LAB_0024f64d;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool CommandLineInterface::ParseInputFiles(
    DescriptorPool* descriptor_pool, DiskSourceTree* source_tree,
    std::vector<const FileDescriptor*>* parsed_files) {

  if (!proto_path_.empty()) {
    // Track unused imports in all source files that were loaded from the
    // filesystem. We do not track unused imports for files loaded from
    // descriptor sets as they may be programmatically generated in which case
    // exerting this level of rigor is less desirable. We're also making the
    // assumption that the initial parse of the proto from the filesystem
    // was rigorous in checking unused imports and that the descriptor set
    // being parsed was produced then and that it was subsequent mutations
    // of that descriptor set that left unused imports.
    //
    // Note that relying on proto_path exclusively is limited in that we may
    // be loading descriptors from both the filesystem and descriptor sets
    // depending on the invocation. At least for invocations that are
    // exclusively reading from descriptor sets, we can eliminate this failure
    // condition.
    for (const auto& input_file : input_files_) {
      descriptor_pool->AddDirectInputFile(input_file);
    }
  }

  bool result = true;
  // Parse each file.
  for (const auto& input_file : input_files_) {
    // Import the file.
    const FileDescriptor* parsed_file =
        descriptor_pool->FindFileByName(input_file);
    if (parsed_file == nullptr) {
      result = false;
      break;
    }
    parsed_files->push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      std::cerr << parsed_file->name()
                << ": This file contains services, but "
                   "--disallow_services was used."
                << std::endl;
      result = false;
      break;
    }

    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); ++i) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << absl::StrReplaceAll(
                           direct_dependencies_violation_msg_,
                           {{"%s", parsed_file->dependency(i)->name()}})
                    << std::endl;
        }
      }
      if (indirect_imports) {
        result = false;
        break;
      }
    }
  }
  descriptor_pool->ClearDirectInputFiles();
  return result;
}